

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnginput.cc
# Opt level: O0

void __thiscall PngInput::PngInput(PngInput *this)

{
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffc8;
  ImageInput *in_stack_ffffffffffffffd0;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  ImageInput::ImageInput(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  *in_RDI = &PTR__PngInput_00433840;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x33878e);
  lodepng::State::State((State *)0x33879f);
  *(undefined1 *)(in_RDI + 0xaf) = 0;
  *(undefined4 *)((long)in_RDI + 0x57c) = 0;
  *(undefined1 *)(in_RDI + 0xb0) = 0;
  return;
}

Assistant:

PngInput() : ImageInput("png") {}